

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

optional<slang::ast::SequenceRange> __thiscall
slang::ast::SequenceConcatExpr::computeSequenceLengthImpl(SequenceConcatExpr *this)

{
  bool bVar1;
  pointer pEVar2;
  uint *puVar3;
  SequenceRange res;
  uint maxVal;
  bool acceptsOnlyEmpty;
  iterator it;
  uint32_t delayMax;
  uint32_t delayMin;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>
  *in_stack_ffffffffffffff48;
  SequenceRange *__t;
  uint in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>
  *in_stack_ffffffffffffff58;
  byte local_99;
  SequenceRange local_84;
  Element *local_78;
  uint local_6c;
  Element *local_68;
  bitmask<slang::ast::NondegeneracyStatus> local_5c;
  span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL> local_58 [2];
  byte local_31;
  Element *local_30;
  __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
  local_28;
  int local_20;
  uint32_t local_1c;
  _Optional_payload_base<slang::ast::SequenceRange> local_10;
  
  local_1c = 0;
  local_20 = 0;
  local_28._M_current =
       (Element *)
       std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::begin
                 (in_stack_ffffffffffffff48);
  while( true ) {
    local_30 = (Element *)
               std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::end
                         (in_stack_ffffffffffffff58);
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff48);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
    ::operator->(&local_28);
    not_null<const_slang::ast::AssertionExpr_*>::operator->
              ((not_null<const_slang::ast::AssertionExpr_*> *)0xb64a82);
    AssertionExpr::checkNondegeneracy
              ((AssertionExpr *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    in_stack_ffffffffffffff58 = local_58;
    bitmask<slang::ast::NondegeneracyStatus>::bitmask(&local_5c,AcceptsOnlyEmpty);
    local_31 = bitmask<slang::ast::NondegeneracyStatus>::has
                         ((bitmask<slang::ast::NondegeneracyStatus> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (bitmask<slang::ast::NondegeneracyStatus> *)in_stack_ffffffffffffff48);
    local_68 = (Element *)
               std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>::
               begin(in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff48);
    local_99 = 0;
    if (bVar1) {
      local_99 = local_31 ^ 0xff;
    }
    if ((local_99 & 1) != 0) {
      local_20 = 1;
      local_1c = 1;
    }
    pEVar2 = __gnu_cxx::
             __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
             ::operator->(&local_28);
    if (((pEVar2->delay).min == 0) || ((local_31 & 1) == 0)) {
      pEVar2 = __gnu_cxx::
               __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
               ::operator->(&local_28);
      in_stack_ffffffffffffff54 = (pEVar2->delay).min;
    }
    else {
      pEVar2 = __gnu_cxx::
               __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
               ::operator->(&local_28);
      in_stack_ffffffffffffff54 = (pEVar2->delay).min - 1;
    }
    local_1c = in_stack_ffffffffffffff54 + local_1c;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
    ::operator->(&local_28);
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0xb64b93);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
      ::operator->(&local_28);
      puVar3 = std::optional<unsigned_int>::value
                         ((optional<unsigned_int> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      local_6c = *puVar3;
      in_stack_ffffffffffffff50 = local_6c;
      if ((local_6c != 0) && ((local_31 & 1) != 0)) {
        in_stack_ffffffffffffff50 = local_6c - 1;
      }
      local_20 = in_stack_ffffffffffffff50 + local_20;
    }
    local_78 = (Element *)
               __gnu_cxx::
               __normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
               ::operator++((__normal_iterator<const_slang::ast::SequenceConcatExpr::Element_*,_std::span<const_slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>_>
                             *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
  }
  __t = &local_84;
  SequenceRange::SequenceRange((SequenceRange *)0xb64c19);
  local_84.min = local_1c;
  std::optional<unsigned_int>::optional<unsigned_int_&,_true>
            ((optional<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
             ,&__t->min);
  std::optional<slang::ast::SequenceRange>::optional<slang::ast::SequenceRange,_true>
            ((optional<slang::ast::SequenceRange> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__t);
  return (_Optional_base<slang::ast::SequenceRange,_true,_true>)
         (_Optional_base<slang::ast::SequenceRange,_true,_true>)local_10;
}

Assistant:

std::optional<SequenceRange> SequenceConcatExpr::computeSequenceLengthImpl() const {
    uint32_t delayMin = 0;
    uint32_t delayMax = 0;
    for (auto it = elements.begin(); it != elements.end(); it++) {
        const bool acceptsOnlyEmpty = it->sequence->checkNondegeneracy().status.has(
            NondegeneracyStatus::AcceptsOnlyEmpty);

        // Default delay length for concat sequence is 1 if it admits a non-empty match.
        if (it == elements.begin() && !acceptsOnlyEmpty)
            delayMin = delayMax = 1;

        // (empty ##n seq), where n is greater than 0, is equivalent to (##(n-1) seq).
        // Also ((##n empty) ; (seq ##n empty)), where n is greater than 0, is equivalent to
        // ((##(n-1) `true) ; (seq ##(n-1) `true))
        delayMin += (it->delay.min && acceptsOnlyEmpty) ? it->delay.min - 1 : it->delay.min;
        if (it->delay.max.has_value()) {
            const auto maxVal = it->delay.max.value();
            delayMax += (maxVal && acceptsOnlyEmpty) ? maxVal - 1 : maxVal;
        }
    }

    SequenceRange res;
    res.min = delayMin;
    res.max = delayMax;
    return res;
}